

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoll.c
# Opt level: O2

int ffgcxuk(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG nrows,long input_first_bit,
           int input_nbits,uint *array,int *status)

{
  FITSfile *pFVar1;
  tcolumn *ptVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  char *err_message;
  int iVar8;
  uint uVar9;
  uint colbyte [5];
  
  if (nrows == 0 || 0 < *status) {
    return *status;
  }
  if (firstrow < 1) {
    snprintf((char *)colbyte,0x51,"Starting row number is less than 1: %ld (ffgcxuk)",firstrow);
    ffpmsg((char *)colbyte);
    *status = 0x133;
    return 0x133;
  }
  if (input_first_bit < 1) {
    snprintf((char *)colbyte,0x51,"Starting bit number is less than 1: %ld (ffgcxuk)",
             input_first_bit);
  }
  else {
    if (input_nbits < 0x21) {
      if (fptr->HDUposition == fptr->Fptr->curhdu) {
        if ((fptr->Fptr->datastart == -1) && (iVar3 = ffrdef(fptr,status), 0 < iVar3)) {
          return *status;
        }
      }
      else {
        ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
      }
      pFVar1 = fptr->Fptr;
      if (pFVar1->hdutype != 2) {
        ffpmsg("This is not a binary table extension (ffgcxuk)");
        *status = 0xe3;
        return 0xe3;
      }
      if (pFVar1->tfield < colnum) {
        snprintf((char *)colbyte,0x51,"Specified column number is out of range: %d (ffgcxuk)",
                 (ulong)(uint)colnum);
        ffpmsg((char *)colbyte);
        snprintf((char *)colbyte,0x51,"  There are %d columns in this table.",
                 (ulong)(uint)fptr->Fptr->tfield);
        ffpmsg((char *)colbyte);
        *status = 0x12e;
        return 0x12e;
      }
      ptVar2 = pFVar1->tableptr;
      uVar7 = ptVar2[(long)colnum + -1].tdatatype;
      uVar9 = -uVar7;
      if (0 < (int)uVar7) {
        uVar9 = uVar7;
      }
      if (0xb < uVar9) {
        ffpmsg("Can only read bits from X or B type columns. (ffgcxuk)");
        *status = 0x136;
        return 0x136;
      }
      lVar4 = (input_nbits + input_first_bit + -2) / 8;
      if (uVar7 == 0xb) {
        if ((lVar4 << 0x20) + 0x100000000 >> 0x20 <= ptVar2[(long)colnum + -1].trepeat)
        goto LAB_0015041b;
      }
      else if ((uVar7 != 1) ||
              (input_nbits + input_first_bit + -1 <= ptVar2[(long)colnum + -1].trepeat)) {
LAB_0015041b:
        uVar5 = input_first_bit - 1U >> 3;
        lVar6 = 0;
        if (nrows < 1) {
          nrows = lVar6;
        }
        do {
          if (lVar6 == nrows) {
LAB_0015051b:
            return *status;
          }
          iVar3 = ffgcvuk(fptr,colnum,firstrow + lVar6,(long)((uVar5 << 0x20) + 0x100000000) >> 0x20
                          ,(long)((lVar4 - uVar5 << 0x20) + 0x100000000) >> 0x20,0,colbyte,
                          (int *)0x0,status);
          if (0 < iVar3) {
            ffpmsg("Error reading bytes from column (ffgcxuk)");
            goto LAB_0015051b;
          }
          array[lVar6] = 0;
          uVar9 = 0;
          iVar3 = input_nbits;
          uVar7 = (uint)(input_first_bit - 1U) & 7;
          while (iVar3 != 0) {
            iVar8 = 8 - (int)uVar7 % 8;
            if (iVar3 < iVar8) {
              iVar8 = iVar3;
            }
            iVar3 = iVar3 - iVar8;
            uVar9 = uVar9 | (colbyte[(int)uVar7 / 8] >>
                            (8U - ((char)((int)uVar7 % 8) + (char)iVar8) & 0x1f)) <<
                            ((byte)iVar3 & 0x1f);
            array[lVar6] = uVar9;
            uVar7 = uVar7 + iVar8;
          }
          lVar6 = lVar6 + 1;
        } while( true );
      }
      err_message = "Too many bits. Tried to read past width of column (ffgcxuk)";
      goto LAB_00150279;
    }
    snprintf((char *)colbyte,0x51,"Number of bits to read is > 32: %d (ffgcxuk)",input_nbits);
  }
  err_message = (char *)colbyte;
LAB_00150279:
  ffpmsg(err_message);
  *status = 0x134;
  return 0x134;
}

Assistant:

int ffgcxuk(fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column to read (1 = 1st col)  */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)         */
            LONGLONG  nrows,      /* I - no. of rows to read                     */
            long  input_first_bit, /* I - first bit to read (1 = 1st)        */
            int   input_nbits,     /* I - number of bits to read (<= 32)     */
            unsigned int *array,   /* O - array of integer values            */
            int  *status)     /* IO - error status                           */
/*
  Read a consecutive string of bits from an 'X' or 'B' column and
  interprete them as an unsigned integer.  The number of bits must be
  less than or equal to 32 or the total number of bits in the column, 
  which ever is less.
*/
{
    int ii, firstbit, nbits, bytenum, startbit, numbits, endbit;
    int firstbyte, lastbyte, nbytes, rshift, lshift;
    unsigned int colbyte[5];
    tcolumn *colptr;
    char message[FLEN_ERRMSG];

    if (*status > 0 || nrows == 0)
        return(*status);

    /*  check input parameters */
    if (firstrow < 1)
    {
          snprintf(message, FLEN_ERRMSG,"Starting row number is less than 1: %ld (ffgcxuk)",
                (long) firstrow);
          ffpmsg(message);
          return(*status = BAD_ROW_NUM);
    }
    else if (input_first_bit < 1)
    {
          snprintf(message, FLEN_ERRMSG,"Starting bit number is less than 1: %ld (ffgcxuk)",
                input_first_bit);
          ffpmsg(message);
          return(*status = BAD_ELEM_NUM);
    }
    else if (input_nbits > 32)
    {
          snprintf(message, FLEN_ERRMSG,"Number of bits to read is > 32: %d (ffgcxuk)",
                input_nbits);
          ffpmsg(message);
          return(*status = BAD_ELEM_NUM);
    }

    /* position to the correct HDU */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype != BINARY_TBL)
    {
        ffpmsg("This is not a binary table extension (ffgcxuk)");
        return(*status = NOT_BTABLE);
    }

    if (colnum > (fptr->Fptr)->tfield)
    {
      snprintf(message, FLEN_ERRMSG,"Specified column number is out of range: %d (ffgcxuk)",
                colnum);
        ffpmsg(message);
        snprintf(message, FLEN_ERRMSG,"  There are %d columns in this table.",
                (fptr->Fptr)->tfield );
        ffpmsg(message);

        return(*status = BAD_COL_NUM);
    }       

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */

    if (abs(colptr->tdatatype) > TBYTE)
    {
        ffpmsg("Can only read bits from X or B type columns. (ffgcxuk)");
        return(*status = NOT_LOGICAL_COL); /* not correct datatype column */
    }

    firstbyte = (input_first_bit - 1              ) / 8 + 1;
    lastbyte  = (input_first_bit + input_nbits - 2) / 8 + 1;
    nbytes = lastbyte - firstbyte + 1;

    if (colptr->tdatatype == TBIT && 
        input_first_bit + input_nbits - 1 > (long) colptr->trepeat)
    {
        ffpmsg("Too many bits. Tried to read past width of column (ffgcxuk)");
        return(*status = BAD_ELEM_NUM);
    }
    else if (colptr->tdatatype == TBYTE && lastbyte > (long) colptr->trepeat)
    {
        ffpmsg("Too many bits. Tried to read past width of column (ffgcxuk)");
        return(*status = BAD_ELEM_NUM);
    }

    for (ii = 0; ii < nrows; ii++)
    {
        /* read the relevant bytes from the row */
        if (ffgcvuk(fptr, colnum, firstrow+ii, firstbyte, nbytes, 0, 
               colbyte, NULL, status) > 0)
        {
             ffpmsg("Error reading bytes from column (ffgcxuk)");
             return(*status);
        }

        firstbit = (input_first_bit - 1) % 8; /* modulus operator */
        nbits = input_nbits;

        array[ii] = 0;

        /* select and shift the bits from each byte into the output word */
        while(nbits)
        {
            bytenum = firstbit / 8;

            startbit = firstbit % 8;  
            numbits = minvalue(nbits, 8 - startbit);
            endbit = startbit + numbits - 1;

            rshift = 7 - endbit;
            lshift = nbits - numbits;

            array[ii] = ((colbyte[bytenum] >> rshift) << lshift) | array[ii];

            nbits -= numbits;
            firstbit += numbits;
        }
    }

    return(*status);
}